

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O2

void __thiscall netbase_tests::netbase_networks::test_method(netbase_networks *this)

{
  Network NVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  check_type cVar4;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  lazy_ostream local_d8;
  undefined1 *local_c8;
  char **local_c0;
  allocator<char> local_b1;
  assertion_result local_b0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  string local_78;
  CNetAddr local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x26;
  file.m_begin = (iterator)&local_88;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_98,msg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"127.0.0.1",&local_b1);
  ResolveIP(&local_58,&local_78);
  NVar1 = CNetAddr::GetNetwork(&local_58);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(NVar1 == NET_UNROUTABLE);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ResolveIP(\"127.0.0.1\").GetNetwork() == NET_UNROUTABLE";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_f0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_f8,0x26);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_58.m_addr);
  std::__cxx11::string::~string((string *)&local_78);
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x27;
  file_00.m_begin = (iterator)&local_108;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_118,
             msg_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"::1",&local_b1);
  ResolveIP(&local_58,&local_78);
  NVar1 = CNetAddr::GetNetwork(&local_58);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(NVar1 == NET_UNROUTABLE);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ResolveIP(\"::1\").GetNetwork() == NET_UNROUTABLE";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_120 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_128,0x27);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_58.m_addr);
  std::__cxx11::string::~string((string *)&local_78);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = &DAT_00000028;
  file_01.m_begin = (iterator)&local_138;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_148,
             msg_01);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"8.8.8.8",&local_b1);
  ResolveIP(&local_58,&local_78);
  NVar1 = CNetAddr::GetNetwork(&local_58);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(NVar1 == NET_IPV4);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ResolveIP(\"8.8.8.8\").GetNetwork() == NET_IPV4";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_150 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_158,0x28);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_58.m_addr);
  std::__cxx11::string::~string((string *)&local_78);
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x29;
  file_02.m_begin = (iterator)&local_168;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_178,
             msg_02);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"2001::8888",&local_b1);
  ResolveIP(&local_58,&local_78);
  NVar1 = CNetAddr::GetNetwork(&local_58);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(NVar1 == NET_IPV6);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ResolveIP(\"2001::8888\").GetNetwork() == NET_IPV6";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_180 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_188,0x29);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_58.m_addr);
  std::__cxx11::string::~string((string *)&local_78);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x2a;
  file_03.m_begin = (iterator)&local_198;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1a8,
             msg_03);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion",
             &local_b1);
  ResolveIP(&local_58,&local_78);
  NVar1 = CNetAddr::GetNetwork(&local_58);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(NVar1 == NET_ONION);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = 
  "ResolveIP(\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\").GetNetwork() == NET_ONION"
  ;
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1b0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_1b8,0x2a);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_58.m_addr);
  std::__cxx11::string::~string((string *)&local_78);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x2b;
  file_04.m_begin = (iterator)&local_1c8;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1d8,
             msg_04);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"foo.com",&local_b1);
  CreateInternal(&local_58,&local_78);
  NVar1 = CNetAddr::GetNetwork(&local_58);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(NVar1 == NET_INTERNAL);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "CreateInternal(\"foo.com\").GetNetwork() == NET_INTERNAL";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1e0 = "";
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_1e8,0x2b);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_58.m_addr);
  std::__cxx11::string::~string((string *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(netbase_networks)
{
    BOOST_CHECK(ResolveIP("127.0.0.1").GetNetwork() == NET_UNROUTABLE);
    BOOST_CHECK(ResolveIP("::1").GetNetwork() == NET_UNROUTABLE);
    BOOST_CHECK(ResolveIP("8.8.8.8").GetNetwork() == NET_IPV4);
    BOOST_CHECK(ResolveIP("2001::8888").GetNetwork() == NET_IPV6);
    BOOST_CHECK(ResolveIP("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion").GetNetwork() == NET_ONION);
    BOOST_CHECK(CreateInternal("foo.com").GetNetwork() == NET_INTERNAL);
}